

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_shrinkToFit_failure_growStrategyNull_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *expr;
  ulong uVar4;
  int line;
  size_t in_RSI;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  code *local_48;
  code *pcStack_40;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  void *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 7;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy(9,in_RSI);
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = private_ACUtilsTest_ADynArray_realloc((void *)0x0,local_28);
  for (uVar4 = 0; uVar4 < 6; uVar4 = uVar4 + 1) {
    *(undefined1 *)((long)local_20 + uVar4) = 0x35;
  }
  local_38 = 0;
  *(undefined1 *)((long)local_20 + 6) = 0x30;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_shrinkToFit(&local_48,1);
  if (bVar1 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1bf);
    if (local_30 == 7) {
      sVar5 = 0x1c0;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x1c0);
      sVar2 = local_28;
      sVar5 = private_ACUtilsTest_ADynArray_growStrategy(9,sVar5);
      if (sVar2 == sVar5) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x1c1);
        if (local_20 == (void *)0x0) {
          sVar2 = 0;
          pcVar9 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar6 = "(void*) array.buffer != NULL";
          pcVar7 = "(void*) array.buffer";
          line = 0x1c2;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x1c2);
          for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
            if ((long)*(char *)((long)local_20 + lVar8) != 0x35) {
              pcVar9 = "\'5\'";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
              pcVar6 = "array.buffer[i] == \'5\'";
              pcVar7 = "array.buffer[i]";
              line = 0x1c4;
              sVar2 = (long)*(char *)((long)local_20 + lVar8);
              goto LAB_0010d0ef;
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x1c4);
          }
          sVar2 = (size_t)*(char *)((long)local_20 + 6);
          if (sVar2 == 0x30) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x1c5);
            if (local_38 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x1c6);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x1c7);
                (*pcStack_40)(local_20);
                return;
              }
              pcVar9 = "0";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
              line = 0x1c7;
              sVar2 = private_ACUtilsTest_ADynArray_reallocCount;
            }
            else {
              pcVar9 = (char *)0x0;
              expr = "Assertion \'_ck_x == NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar6 = "(void*) array.growStrategy == NULL";
              pcVar7 = "(void*) array.growStrategy";
              line = 0x1c6;
              sVar2 = local_38;
            }
          }
          else {
            pcVar9 = "\'0\'";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2] == \'0\'";
            pcVar7 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2]";
            line = 0x1c5;
          }
        }
      }
      else {
        pcVar9 = 
        "private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char))"
        ;
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar6 = 
        "array.capacity == private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char))"
        ;
        pcVar7 = "array.capacity";
        line = 0x1c1;
      }
    }
    else {
      pcVar9 = "private_ACUtilsTest_ADynArray_capacityMin - 1";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar6 = "array.size == private_ACUtilsTest_ADynArray_capacityMin - 1";
      pcVar7 = "array.size";
      line = 0x1c0;
      sVar2 = local_30;
    }
  }
  else {
    sVar2 = (size_t)bVar1;
    pcVar9 = "false";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer)) == false";
    pcVar7 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer))";
    line = 0x1bf;
  }
LAB_0010d0ef:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar3,pcVar6,pcVar7,sVar2,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_shrinkToFit_failure_growStrategyNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin - 1;
    array.capacity = private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char));
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    array.growStrategy = nullptr;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_shrinkToFit(&array), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin - 1);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char)));
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 2; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}